

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx2.cpp
# Opt level: O0

void __thiscall ncnn::InnerProduct_x86_avx2::InnerProduct_x86_avx2(InnerProduct_x86_avx2 *this)

{
  long *in_RDI;
  InnerProduct *unaff_retaddr;
  
  InnerProduct::InnerProduct(unaff_retaddr);
  *in_RDI = (long)&PTR_create_pipeline_009b8560;
  in_RDI[0x27] = (long)&PTR__InnerProduct_x86_avx2_009b85e0;
  ncnn::Mat::Mat((Mat *)(in_RDI + 3));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0xc));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x15));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x1e));
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb) = 1;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x11) = 1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  return;
}

Assistant:

InnerProduct_x86_avx2::InnerProduct_x86_avx2()
{
#if __SSE2__
    support_packing = true;
#if __AVX2__
    support_weight_fp16_storage = true;
#endif
#endif // __SSE2__

    flatten = 0;
    activation = 0;
}